

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc,string *config)

{
  string *config_00;
  size_t __n;
  pointer pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  cmGlobalNinjaGenerator *pcVar6;
  mapped_type *pmVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string input;
  string output;
  string macdir;
  string nativeMacdir;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  size_type local_70;
  pointer local_68;
  size_type local_60;
  undefined1 *puStack_58;
  undefined1 local_50 [32];
  
  bVar3 = cmGeneratorTarget::IsBundleOnApple
                    ((this->Generator->super_cmCommonTargetGenerator).GeneratorTarget);
  if (!bVar3) {
    return;
  }
  cmOSXBundleGenerator::InitMacOSXContentDirectory
            (&local_110,
             (this->Generator->OSXBundleGenerator)._M_t.
             super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
             .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,pkgloc,config);
  config_00 = &this->FileConfig;
  __n = config->_M_string_length;
  if ((__n != (this->FileConfig)._M_string_length) ||
     ((__n != 0 &&
      (iVar4 = bcmp((config->_M_dataplus)._M_p,(config_00->_M_dataplus)._M_p,__n), iVar4 != 0)))) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory
              (&local_90,
               (this->Generator->OSXBundleGenerator)._M_t.
               super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
               .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,pkgloc,config_00);
    _Var2._M_p = local_90._M_dataplus._M_p;
    if (local_110._M_string_length == local_90._M_string_length) {
      if ((pointer)local_110._M_string_length == (pointer)0x0) {
        bVar3 = true;
      }
      else {
        iVar4 = bcmp(local_110._M_dataplus._M_p,local_90._M_dataplus._M_p,local_110._M_string_length
                    );
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p != &local_90.field_2) {
      operator_delete(_Var2._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) goto LAB_00288f7f;
  }
  psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar1,pcVar1 + psVar5->_M_string_length);
  pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->Generator->LocalGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,&local_150);
  std::__cxx11::string::_M_assign((string *)&local_150);
  _Var2._M_p = local_110._M_dataplus._M_p;
  puStack_58 = local_50;
  local_60 = 1;
  local_50[0] = 0x2f;
  cmsys::SystemTools::GetFilenameName(&local_b0,&local_150);
  local_90._M_dataplus._M_p = (pointer)local_110._M_string_length;
  local_90._M_string_length = (size_type)_Var2._M_p;
  local_90.field_2._M_allocated_capacity = local_60;
  local_90.field_2._8_8_ = puStack_58;
  local_70 = local_b0._M_string_length;
  local_68 = local_b0._M_dataplus._M_p;
  views._M_len = 3;
  views._M_array = (iterator)&local_90;
  cmCatViews_abi_cxx11_(&local_130,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->Generator->LocalGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,&local_130);
  std::__cxx11::string::_M_assign((string *)&local_130);
  pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->Generator->LocalGenerator);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_130._M_dataplus._M_p,
             local_130._M_dataplus._M_p + local_130._M_string_length);
  cmGlobalNinjaGenerator::WriteMacOSXContentBuild(pcVar6,&local_d0,&local_f0,config_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
           ::operator[](&this->Generator->Configs,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &pmVar7->ExtraFiles,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
LAB_00288f7f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc, const std::string& config)
{
  // Skip OS X content when not building a Framework or Bundle.
  if (!this->Generator->GetGeneratorTarget()->IsBundleOnApple()) {
    return;
  }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc,
                                                                    config);

  // Reject files that collide with files from the Ninja file's native config.
  if (config != this->FileConfig) {
    std::string nativeMacdir =
      this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(
        pkgloc, this->FileConfig);
    if (macdir == nativeMacdir) {
      return;
    }
  }

  // Get the input file location.
  std::string input = source.GetFullPath();
  input = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(input);

  // Get the output file location.
  std::string output =
    cmStrCat(macdir, '/', cmSystemTools::GetFilenameName(input));
  output = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(output);

  // Write a build statement to copy the content into the bundle.
  this->Generator->GetGlobalGenerator()->WriteMacOSXContentBuild(
    input, output, this->FileConfig);

  // Add as a dependency to the target so that it gets called.
  this->Generator->Configs[config].ExtraFiles.push_back(std::move(output));
}